

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void CloseDest(void)

{
  int *piVar1;
  int local_10 [2];
  
  WriteDest();
  if (FP_Output != (FILE *)0x0) {
    if (size != -1) {
      if (size < destlen) {
        ErrorInt("File exceeds \'size\' by",destlen - size,PASS3);
      }
      memset(WriteBuffer,0,0x2000);
      while (destlen < size) {
        local_10[1] = 0x2000;
        local_10[0] = size - destlen;
        piVar1 = std::min<int>(local_10 + 1,local_10);
        WBLength = *piVar1;
        WriteDest();
      }
      size = -1;
    }
    fclose((FILE *)FP_Output);
    FP_Output = (FILE *)0x0;
  }
  return;
}

Assistant:

void CloseDest() {
	// Flush buffer before any other operations
	WriteDest();
	// does main output file exist? (to close it)
	if (FP_Output == NULL) return;
	// pad to desired size (and check for exceed of it)
	if (size != -1L) {
		if (destlen > size) {
			ErrorInt("File exceeds 'size' by", destlen - size);
		}
		memset(WriteBuffer, 0, DESTBUFLEN);
		while (destlen < size) {
			WBLength = std::min(aint(DESTBUFLEN), size-destlen);
			WriteDest();
		}
		size = -1L;
	}
	fclose(FP_Output);
	FP_Output = NULL;
}